

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O1

SP __thiscall pbrt::SemanticParser::emitDisk(SemanticParser *this,SP *shape)

{
  element_type *peVar1;
  long lVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  _Atomic_word _Var11;
  _Atomic_word _Var12;
  bool bVar13;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  float fVar15;
  SP SVar16;
  SP ours;
  undefined1 local_99;
  undefined1 local_98 [32];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_70 [2];
  SP local_60;
  SP local_50;
  undefined8 local_40;
  _Base_ptr local_38;
  
  local_40 = *(undefined8 *)(*in_RDX + 0x58);
  local_38 = *(_Base_ptr *)(*in_RDX + 0x60);
  if (local_38 != (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_38->_M_parent = *(int *)&local_38->_M_parent + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_38->_M_parent = *(int *)&local_38->_M_parent + 1;
    }
  }
  findOrCreateMaterial((SemanticParser *)local_98,(SP *)shape);
  local_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pbrt::Disk,std::allocator<pbrt::Disk>,std::shared_ptr<pbrt::Material>>
            (a_Stack_70,(Disk **)&local_78,(allocator<pbrt::Disk> *)&local_99,
             (shared_ptr<pbrt::Material> *)local_98);
  std::__shared_ptr<pbrt::Disk,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<pbrt::Disk,pbrt::Disk>
            ((__shared_ptr<pbrt::Disk,(__gnu_cxx::_Lock_policy)2> *)&local_78,(Disk *)local_78._M_pi
            );
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
  }
  if (local_38 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
  }
  lVar2 = *in_RDX;
  uVar3 = *(undefined4 *)(lVar2 + 0x78);
  fVar15 = *(float *)(lVar2 + 0x7c);
  uVar4 = *(undefined4 *)(lVar2 + 0x80);
  fVar5 = *(float *)(lVar2 + 0x84);
  uVar6 = *(undefined4 *)(lVar2 + 0x88);
  uVar7 = *(undefined4 *)(lVar2 + 0x8c);
  uVar8 = *(undefined4 *)(lVar2 + 0x90);
  uVar9 = *(undefined4 *)(lVar2 + 0x94);
  uVar10 = *(undefined4 *)(lVar2 + 0x9c);
  _Var11 = *(_Atomic_word *)(lVar2 + 0xa0);
  _Var12 = *(_Atomic_word *)(lVar2 + 0xa4);
  *(undefined4 *)&local_78._M_pi[9]._vptr__Sp_counted_base = *(undefined4 *)(lVar2 + 0x98);
  *(undefined4 *)((long)&local_78._M_pi[9]._vptr__Sp_counted_base + 4) = uVar10;
  local_78._M_pi[9]._M_use_count = _Var11;
  local_78._M_pi[9]._M_weak_count = _Var12;
  *(undefined4 *)&(((element_type *)(local_78._M_pi + 8))->super_Entity)._vptr_Entity = uVar6;
  *(undefined4 *)((long)&(((element_type *)(local_78._M_pi + 8))->super_Entity)._vptr_Entity + 4) =
       uVar7;
  *(undefined4 *)
   &(((element_type *)(local_78._M_pi + 8))->super_Entity).
    super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
    super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = uVar8;
  *(undefined4 *)
   ((long)&(((element_type *)(local_78._M_pi + 8))->super_Entity).
           super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
           super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2> + 4) = uVar9;
  (((mat3f *)&local_78._M_pi[7]._vptr__Sp_counted_base)->vx).x = (float)uVar3;
  (((mat3f *)&local_78._M_pi[7]._vptr__Sp_counted_base)->vx).y = fVar15;
  *(undefined4 *)
   &((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_pi[7]._M_use_count)->_M_pi = uVar4;
  ((vec3f *)&local_78._M_pi[7]._M_weak_count)->x = fVar5;
  lVar2 = *in_RDX;
  peVar1 = (element_type *)(local_98 + 0x10);
  local_98._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"radius","");
  fVar15 = syntactic::ParamSet::getParam1f((ParamSet *)(lVar2 + 8),(string *)local_98,0.0);
  *(float *)&local_78._M_pi[10]._vptr__Sp_counted_base = fVar15;
  if ((element_type *)local_98._0_8_ != peVar1) {
    operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
  }
  lVar2 = *in_RDX;
  local_98._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"height","");
  bVar13 = syntactic::ParamSet::hasParam1f((ParamSet *)(lVar2 + 8),(string *)local_98);
  if ((element_type *)local_98._0_8_ != peVar1) {
    operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
  }
  if (bVar13) {
    lVar2 = *in_RDX;
    local_98._0_8_ = peVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"height","");
    fVar15 = syntactic::ParamSet::getParam1f((ParamSet *)(lVar2 + 8),(string *)local_98,0.0);
    *(float *)((long)&local_78._M_pi[10]._vptr__Sp_counted_base + 4) = fVar15;
    if ((element_type *)local_98._0_8_ != peVar1) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
    }
  }
  local_50.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_78._M_pi;
  local_50.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_70[0]._M_pi;
  if (a_Stack_70[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (a_Stack_70[0]._M_pi)->_M_use_count = (a_Stack_70[0]._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (a_Stack_70[0]._M_pi)->_M_use_count = (a_Stack_70[0]._M_pi)->_M_use_count + 1;
    }
  }
  local_60.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*in_RDX;
  local_60.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if ((_Base_ptr)
      local_60.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((_Base_ptr)
               local_60.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_parent =
           *(int *)&((_Base_ptr)
                    local_60.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_parent + 1;
      UNLOCK();
    }
    else {
      *(int *)&((_Base_ptr)
               local_60.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_parent =
           *(int *)&((_Base_ptr)
                    local_60.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_parent + 1;
    }
  }
  extractTextures((SemanticParser *)shape,&local_50,&local_60);
  _Var14._M_pi = extraout_RDX;
  if ((_Base_ptr)
      local_60.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var14._M_pi = extraout_RDX_00;
  }
  if (local_50.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var14._M_pi = extraout_RDX_01;
  }
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_78._M_pi;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_70[0]._M_pi;
  SVar16.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var14._M_pi;
  SVar16.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar16.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Shape::SP SemanticParser::emitDisk(pbrt::syntactic::Shape::SP shape)
  {
    Disk::SP ours = std::make_shared<Disk>(findOrCreateMaterial(shape->material));

    ours->transform = shape->transform.atStart;
    ours->radius    = shape->getParam1f("radius");
        
    if (shape->hasParam1f("height"))
      ours->height    = shape->getParam1f("height");
        
    extractTextures(ours,shape);
      
    return ours;
  }